

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluk.c
# Opt level: O2

int fffr8uint(double *input,long ntodo,double scale,double zero,int nullcheck,uint nullval,
             char *nullarray,int *anynull,uint *output,int *status)

{
  ushort uVar1;
  char cVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  double dVar6;
  
  if (nullcheck == 0) {
    lVar5 = 0;
    if (0 < ntodo) {
      lVar5 = ntodo;
    }
    if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
      for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
        dVar6 = input[lVar3] * scale + zero;
        if (-0.49 <= dVar6) {
          if (dVar6 <= 4294967295.49) {
            uVar4 = (uint)(long)dVar6;
          }
          else {
            *status = -0xb;
            uVar4 = 0xffffffff;
          }
        }
        else {
          *status = -0xb;
          uVar4 = 0;
        }
        output[lVar3] = uVar4;
      }
    }
    else {
      for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
        dVar6 = input[lVar3];
        if (-0.49 <= dVar6) {
          if (dVar6 <= 4294967295.49) {
            uVar4 = (uint)(long)dVar6;
          }
          else {
            *status = -0xb;
            uVar4 = 0xffffffff;
          }
        }
        else {
          *status = -0xb;
          uVar4 = 0;
        }
        output[lVar3] = uVar4;
      }
    }
  }
  else if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
    lVar5 = 0;
    if (ntodo < 1) {
      ntodo = lVar5;
    }
    for (; ntodo != lVar5; lVar5 = lVar5 + 1) {
      uVar1 = *(ushort *)((long)input + lVar5 * 8 + 6);
      cVar2 = ((uVar1 & 0x7ff0) == 0) * '\x02';
      if ((uVar1 & 0x7ff0) == 0x7ff0) {
        cVar2 = '\x01';
      }
      if (cVar2 == '\0') {
        dVar6 = input[lVar5] * scale + zero;
        if (dVar6 < -0.49) {
LAB_00173a88:
          *status = -0xb;
          output[lVar5] = 0;
        }
        else if (4294967295.49 < dVar6) {
LAB_00173aa2:
          *status = -0xb;
          output[lVar5] = 0xffffffff;
        }
        else {
          output[lVar5] = (uint)(long)dVar6;
        }
      }
      else if (cVar2 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else {
        if (zero < -0.49) goto LAB_00173a88;
        if (4294967295.49 < zero) goto LAB_00173aa2;
        output[lVar5] = (uint)(long)zero;
      }
    }
  }
  else {
    lVar5 = 0;
    if (ntodo < 1) {
      ntodo = lVar5;
    }
    for (; ntodo != lVar5; lVar5 = lVar5 + 1) {
      uVar1 = *(ushort *)((long)input + lVar5 * 8 + 6);
      cVar2 = ((uVar1 & 0x7ff0) == 0) * '\x02';
      if ((uVar1 & 0x7ff0) == 0x7ff0) {
        cVar2 = '\x01';
      }
      if (cVar2 == '\0') {
        dVar6 = input[lVar5];
        if (dVar6 < -0.49) {
          *status = -0xb;
          goto LAB_0017393c;
        }
        if (dVar6 <= 4294967295.49) {
          output[lVar5] = (uint)(long)dVar6;
        }
        else {
          *status = -0xb;
          output[lVar5] = 0xffffffff;
        }
      }
      else if (cVar2 == '\x01') {
        *anynull = 1;
        if (nullcheck == 1) {
          output[lVar5] = nullval;
        }
        else {
          nullarray[lVar5] = '\x01';
        }
      }
      else {
LAB_0017393c:
        output[lVar5] = 0;
      }
    }
  }
  return *status;
}

Assistant:

int fffr8uint(double *input,       /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
   unsigned int  nullval,         /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned int  *output,         /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file.
  Check for null values and do datatype conversion and scaling if required.
  The nullcheck code value determines how any null values in the input array
  are treated.  A null value is an input pixel that is equal to NaN.  If 
  nullcheck = 0, then no checking for nulls is performed and any null values
  will be transformed just like any other pixel.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    long ii;
    double dvalue;
    short *sptr, iret;

    if (nullcheck == 0)     /* no null checking required */
    {
        if (scale == 1. && zero == 0.)      /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++)
            {
                if (input[ii] < DUINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (input[ii] > DUINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UINT_MAX;
                }
                else
                    output[ii] = (unsigned int) input[ii];
            }
        }
        else             /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++)
            {
                dvalue = input[ii] * scale + zero;

                if (dvalue < DUINT_MIN)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = 0;
                }
                else if (dvalue > DUINT_MAX)
                {
                    *status = OVERFLOW_ERR;
                    output[ii] = UINT_MAX;
                }
                else
                    output[ii] = (unsigned int) dvalue;
            }
        }
    }
    else        /* must check for null values */
    {
        sptr = (short *) input;

#if BYTESWAPPED && MACHINE != VAXVMS && MACHINE != ALPHAVMS
        sptr += 3;       /* point to MSBs */
#endif
        if (scale == 1. && zero == 0.)  /* no scaling */
        {       
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                     output[ii] = 0;
              }
              else
                {
                    if (input[ii] < DUINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (input[ii] > DUINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT_MAX;
                    }
                    else
                        output[ii] = (unsigned int) input[ii];
                }
            }
        }
        else                  /* must scale the data */
        {
            for (ii = 0; ii < ntodo; ii++, sptr += 4)
            {
              if (0 != (iret = dnan(*sptr)) )  /* test for NaN or underflow */
              {
                  if (iret == 1)  /* is it a NaN? */
                  {  
                    *anynull = 1;
                    if (nullcheck == 1)
                        output[ii] = nullval;
                    else
                        nullarray[ii] = 1;
                  }
                  else            /* it's an underflow */
                  { 
                    if (zero < DUINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (zero > DUINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT_MAX;
                    }
                    else
                      output[ii] = (unsigned int) zero;
                  }
              }
              else
                {
                    dvalue = input[ii] * scale + zero;

                    if (dvalue < DUINT_MIN)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = 0;
                    }
                    else if (dvalue > DUINT_MAX)
                    {
                        *status = OVERFLOW_ERR;
                        output[ii] = UINT_MAX;
                    }
                    else
                        output[ii] = (unsigned int) dvalue;
                }
            }
        }
    }
    return(*status);
}